

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventHandler.cpp
# Opt level: O0

void __thiscall TgBot::EventHandler::handleUpdate(EventHandler *this,Ptr *update)

{
  EventBroadcaster *pEVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<TgBot::Message> local_68;
  shared_ptr<TgBot::CallbackQuery> local_58;
  shared_ptr<TgBot::ChosenInlineResult> local_48 [2];
  shared_ptr<TgBot::InlineQuery> local_28;
  Ptr *local_18;
  Ptr *update_local;
  EventHandler *this_local;
  
  local_18 = update;
  update_local = (Ptr *)this;
  peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)update);
  bVar2 = std::operator!=(&peVar3->inlineQuery,(nullptr_t)0x0);
  if (bVar2) {
    pEVar1 = this->_broadcaster;
    peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)update);
    std::shared_ptr<TgBot::InlineQuery>::shared_ptr(&local_28,&peVar3->inlineQuery);
    EventBroadcaster::broadcastInlineQuery(pEVar1,&local_28);
    std::shared_ptr<TgBot::InlineQuery>::~shared_ptr(&local_28);
  }
  peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)update);
  bVar2 = std::operator!=(&peVar3->chosenInlineResult,(nullptr_t)0x0);
  if (bVar2) {
    pEVar1 = this->_broadcaster;
    peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)update);
    std::shared_ptr<TgBot::ChosenInlineResult>::shared_ptr(local_48,&peVar3->chosenInlineResult);
    EventBroadcaster::broadcastChosenInlineResult(pEVar1,local_48);
    std::shared_ptr<TgBot::ChosenInlineResult>::~shared_ptr(local_48);
  }
  peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)update);
  bVar2 = std::operator!=(&peVar3->callbackQuery,(nullptr_t)0x0);
  if (bVar2) {
    pEVar1 = this->_broadcaster;
    peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)update);
    std::shared_ptr<TgBot::CallbackQuery>::shared_ptr(&local_58,&peVar3->callbackQuery);
    EventBroadcaster::broadcastCallbackQuery(pEVar1,&local_58);
    std::shared_ptr<TgBot::CallbackQuery>::~shared_ptr(&local_58);
  }
  peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)update);
  bVar2 = std::operator!=(&peVar3->message,(nullptr_t)0x0);
  if (bVar2) {
    peVar3 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)update);
    std::shared_ptr<TgBot::Message>::shared_ptr(&local_68,&peVar3->message);
    handleMessage(this,&local_68);
    std::shared_ptr<TgBot::Message>::~shared_ptr(&local_68);
  }
  return;
}

Assistant:

void EventHandler::handleUpdate(Update::Ptr update) const {
    if (update->inlineQuery != nullptr) {
        _broadcaster.broadcastInlineQuery(update->inlineQuery);
    }
    if (update->chosenInlineResult != nullptr) {
        _broadcaster.broadcastChosenInlineResult(update->chosenInlineResult);
    }
    if (update->callbackQuery != nullptr) {
        _broadcaster.broadcastCallbackQuery(update->callbackQuery);
    }
    if (update->message != nullptr) {
        handleMessage(update->message);
    }
}